

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

int on_url(http_parser *parser,char *at,size_t length)

{
  uint64_t *client;
  undefined8 *puVar1;
  byte bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  cio_http_cb_return cVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n;
  cio_http_location_handler *handler;
  undefined8 *puVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  long *plVar13;
  http_parser_url url;
  
  bVar2 = parser->field_0x16;
  parser[-0x14].http_major = (short)(uint)bVar2;
  parser[-0x14].http_minor = (short)((uint)bVar2 >> 0x10);
  parser[2].content_length = (uint64_t)on_headers_complete;
  parser[1].data = on_header_field_name;
  *(code **)(parser + 2) = on_header_field_value;
  *(code **)&parser[2].http_major = on_body;
  parser[2].data = on_message_complete;
  http_parser_url_init(&url);
  iVar4 = http_parser_parse_url(at,length,(uint)(parser->field_0x16 == '\x05'),&url);
  iVar5 = -1;
  if ((iVar4 == 0) && (((byte)url.field_set & 8) != 0)) {
    lVar11 = *(long *)((long)parser->data + 0x118);
    if (lVar11 == 0) {
      puVar9 = (undefined8 *)0x0;
    }
    else {
      uVar7 = (ulong)url.field_data[3].off;
      uVar8 = (ulong)url.field_data[3].len;
      plVar13 = (long *)((long)parser->data + 0x110);
      puVar9 = (undefined8 *)0x0;
      sVar12 = 0;
      do {
        puVar1 = (undefined8 *)*plVar13;
        pcVar10 = (char *)*puVar1;
        __n = strlen(pcVar10);
        if (((uVar8 <= __n - 1) || (iVar5 = bcmp(at + uVar7,pcVar10,__n), iVar5 != 0)) ||
           ((bVar2 = 1, __n != uVar8 && ((pcVar10[__n - 1] != '/' && ((at + uVar7)[__n] != '/'))))))
        {
          bVar2 = 0;
        }
        if ((bool)(bVar2 & sVar12 < __n)) {
          puVar9 = puVar1;
          sVar12 = __n;
        }
        plVar13 = puVar1 + 2;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    client = &parser[-0x1b].content_length;
    if (puVar9 == (undefined8 *)0x0) {
      parser[1].data = (void *)0x0;
      *(undefined8 *)(parser + 2) = 0;
      iVar5 = 0;
      write_response((cio_http_client *)client,CIO_HTTP_STATUS_NOT_FOUND,(cio_write_buffer *)0x0,
                     (cio_response_written_cb_t)0x0);
    }
    else {
      handler = (cio_http_location_handler *)(*(code *)puVar9[1])(puVar9[3]);
      if (handler == (cio_http_location_handler *)0x0) {
        pcVar10 = "Allocation of handler failed!";
      }
      else if (handler->free == (_func_void_cio_http_location_handler_ptr *)0x0) {
        pcVar10 = "Handler has no function to free!";
      }
      else {
        parser[-0x14].data = handler;
        _Var3 = cio_http_location_handler_no_callbacks(handler);
        if (!_Var3) {
          if ((((((byte)url.field_set & 1) != 0) && (handler->on_schema != (cio_http_data_cb_t)0x0))
              && ((char)parser[-2].content_length == '\0')) &&
             (cVar6 = (*handler->on_schema)
                                ((cio_http_client *)client,at + url.field_data[0].off,
                                 (size_t)url.field_data[0].len), cVar6 == CIO_HTTP_CB_ERROR)) {
            return -1;
          }
          if (((((byte)url.field_set & 2) != 0) && (handler->on_host != (cio_http_data_cb_t)0x0)) &&
             (((char)parser[-2].content_length == '\0' &&
              (cVar6 = (*handler->on_host)((cio_http_client *)client,at + url.field_data[1].off,
                                           (size_t)url.field_data[1].len),
              cVar6 == CIO_HTTP_CB_ERROR)))) {
            return -1;
          }
          if ((((((byte)url.field_set & 4) != 0) && (handler->on_port != (cio_http_data_cb_t)0x0))
              && ((char)parser[-2].content_length == '\0')) &&
             (cVar6 = (*handler->on_port)((cio_http_client *)client,at + url.field_data[2].off,
                                          (size_t)url.field_data[2].len), cVar6 == CIO_HTTP_CB_ERROR
             )) {
            return -1;
          }
          if ((((((byte)url.field_set & 8) != 0) && (handler->on_path != (cio_http_data_cb_t)0x0))
              && ((char)parser[-2].content_length == '\0')) &&
             (cVar6 = (*handler->on_path)((cio_http_client *)client,at + url.field_data[3].off,
                                          (size_t)url.field_data[3].len), cVar6 == CIO_HTTP_CB_ERROR
             )) {
            return -1;
          }
          if (((((byte)url.field_set & 0x10) != 0) && (handler->on_query != (cio_http_data_cb_t)0x0)
              ) && (((char)parser[-2].content_length == '\0' &&
                    (cVar6 = (*handler->on_query)
                                       ((cio_http_client *)client,at + url.field_data[4].off,
                                        (size_t)url.field_data[4].len), cVar6 == CIO_HTTP_CB_ERROR))
                   )) {
            return -1;
          }
          if (((((byte)url.field_set & 0x20) != 0) &&
              (handler->on_fragment != (cio_http_data_cb_t)0x0)) &&
             (((char)parser[-2].content_length == '\0' &&
              (cVar6 = (*handler->on_fragment)
                                 ((cio_http_client *)client,at + url.field_data[5].off,
                                  (size_t)url.field_data[5].len), cVar6 == CIO_HTTP_CB_ERROR)))) {
            return -1;
          }
          if (handler->on_url == (cio_http_data_cb_t)0x0) {
            return 0;
          }
          if ((char)parser[-2].content_length != '\0') {
            return 0;
          }
          cVar6 = (*handler->on_url)((cio_http_client *)client,at,length);
          return cVar6;
        }
        pcVar10 = "No callbacks for given set in handler!";
      }
      handle_server_error((cio_http_client *)client,pcVar10);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int on_url(http_parser *parser, const char *at, size_t length)
{
	struct cio_http_client *client = cio_container_of(parser, struct cio_http_client, parser);

	client->http_method = (enum cio_http_method)client->parser.method;

	client->parser_settings.on_headers_complete = on_headers_complete;
	client->parser_settings.on_header_field = on_header_field_name;
	client->parser_settings.on_header_value = on_header_field_value;
	client->parser_settings.on_body = on_body;
	client->parser_settings.on_message_complete = on_message_complete;

	struct http_parser_url url;
	http_parser_url_init(&url);
	int ret = http_parser_parse_url(at, length, cio_unlikely(parser->method == (unsigned int)HTTP_CONNECT) ? 1 : 0, &url);
	if (cio_unlikely(ret != 0)) {
		return -1;
	}

	if (cio_unlikely(!path_in_url(&url))) {
		return -1;
	}

	const struct cio_http_location *location = find_location(parser->data, at + url.field_data[UF_PATH].off, url.field_data[UF_PATH].len);
	if (cio_unlikely(location == NULL)) {
		client->parser_settings.on_header_field = NULL;
		client->parser_settings.on_header_value = NULL;
		write_response(client, CIO_HTTP_STATUS_NOT_FOUND, NULL, NULL);
		return 0;
	}

	struct cio_http_location_handler *handler = location->alloc_handler(location->config);
	if (cio_unlikely(handler == NULL)) {
		handle_server_error(client, "Allocation of handler failed!");
		return 0;
	}

	if (cio_unlikely(handler->free == NULL)) {
		handle_server_error(client, "Handler has no function to free!");
		return 0;
	}

	client->current_handler = handler;

	if (cio_unlikely(cio_http_location_handler_no_callbacks(handler))) {
		handle_server_error(client, "No callbacks for given set in handler!");
		return 0;
	}

	enum cio_http_cb_return cb_ret = call_url_parts_callback(&url, UF_SCHEMA, handler->on_schema, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_HOST, handler->on_host, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_PORT, handler->on_port, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_PATH, handler->on_path, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_QUERY, handler->on_query, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	cb_ret = call_url_parts_callback(&url, UF_FRAGMENT, handler->on_fragment, client, at);
	if (cio_unlikely(cb_ret == CIO_HTTP_CB_ERROR)) {
		return -1;
	}

	if (handler->on_url && (!client->http_private.response_fired)) {
		return handler->on_url(client, at, length);
	}

	return 0;
}